

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NvmlLib.cpp
# Opt level: O1

NvmlHealth * xmrig::NvmlLib::health(NvmlHealth *__return_storage_ptr__,nvmlDevice_t device)

{
  uint32_t *puVar1;
  iterator iVar2;
  uint in_EAX;
  int iVar3;
  uint32_t i;
  int iVar4;
  uint32_t speed;
  undefined8 uStack_28;
  
  (__return_storage_ptr__->fanSpeed).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  __return_storage_ptr__->clock = 0;
  __return_storage_ptr__->memClock = 0;
  (__return_storage_ptr__->fanSpeed).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->fanSpeed).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  __return_storage_ptr__->power = 0;
  __return_storage_ptr__->temperature = 0;
  if (device != (nvmlDevice_t)0x0) {
    uStack_28._0_4_ = in_EAX;
    (*pNvmlDeviceGetTemperature)(device,0,&__return_storage_ptr__->temperature);
    puVar1 = &__return_storage_ptr__->power;
    (*pNvmlDeviceGetPowerUsage)(device,puVar1);
    (*pNvmlDeviceGetClockInfo)(device,1,&__return_storage_ptr__->clock);
    (*pNvmlDeviceGetClockInfo)(device,2,&__return_storage_ptr__->memClock);
    if (*puVar1 != 0) {
      *puVar1 = *puVar1 / 1000;
    }
    uStack_28 = (ulong)(uint)uStack_28;
    if (pNvmlDeviceGetFanSpeed_v2 == (code *)0x0) {
      (*pNvmlDeviceGetFanSpeed)(device,(long)&uStack_28 + 4);
      iVar2._M_current =
           (__return_storage_ptr__->fanSpeed).
           super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
           super__Vector_impl_data._M_finish;
      if (iVar2._M_current ==
          (__return_storage_ptr__->fanSpeed).
          super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        std::vector<unsigned_int,std::allocator<unsigned_int>>::
        _M_realloc_insert<unsigned_int_const&>
                  ((vector<unsigned_int,std::allocator<unsigned_int>> *)__return_storage_ptr__,iVar2
                   ,(uint *)((long)&uStack_28 + 4));
      }
      else {
        *iVar2._M_current = uStack_28._4_4_;
        (__return_storage_ptr__->fanSpeed).
        super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_finish = iVar2._M_current + 1;
      }
    }
    else {
      iVar4 = 0;
      while( true ) {
        iVar3 = (*pNvmlDeviceGetFanSpeed_v2)(device,iVar4,(uint *)((long)&uStack_28 + 4));
        if (iVar3 != 0) break;
        iVar2._M_current =
             (__return_storage_ptr__->fanSpeed).
             super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
             super__Vector_impl_data._M_finish;
        if (iVar2._M_current ==
            (__return_storage_ptr__->fanSpeed).
            super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage) {
          std::vector<unsigned_int,std::allocator<unsigned_int>>::
          _M_realloc_insert<unsigned_int_const&>
                    ((vector<unsigned_int,std::allocator<unsigned_int>> *)__return_storage_ptr__,
                     iVar2,(uint *)((long)&uStack_28 + 4));
        }
        else {
          *iVar2._M_current = uStack_28._4_4_;
          (__return_storage_ptr__->fanSpeed).
          super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
          super__Vector_impl_data._M_finish = iVar2._M_current + 1;
        }
        iVar4 = iVar4 + 1;
      }
    }
  }
  return __return_storage_ptr__;
}

Assistant:

NvmlHealth xmrig::NvmlLib::health(nvmlDevice_t device)
{
    if (!device) {
        return {};
    }

    NvmlHealth health;
    pNvmlDeviceGetTemperature(device, NVML_TEMPERATURE_GPU, &health.temperature);
    pNvmlDeviceGetPowerUsage(device, &health.power);
    pNvmlDeviceGetClockInfo(device, NVML_CLOCK_SM, &health.clock);
    pNvmlDeviceGetClockInfo(device, NVML_CLOCK_MEM, &health.memClock);

    if (health.power) {
        health.power /= 1000;
    }

    uint32_t speed = 0;

    if (pNvmlDeviceGetFanSpeed_v2) {
        uint32_t i = 0;

        while (pNvmlDeviceGetFanSpeed_v2(device, i, &speed) == NVML_SUCCESS) {
            health.fanSpeed.push_back(speed);
            ++i;
        }

    }
    else {
        pNvmlDeviceGetFanSpeed(device, &speed);

        health.fanSpeed.push_back(speed);
    }

    return health;
}